

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateScalingNodeAnim
          (FBXConverter *this,string *name,Model *param_2,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  ulong __n;
  long lVar1;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> uVar2;
  __uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true> na_00;
  undefined8 *puVar3;
  LayerMap *pLVar4;
  pointer __p;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  
  pLVar4 = (LayerMap *)curves;
  na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)operator_new(0x438);
  *(undefined4 *)
   na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
   super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
   super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = 0;
  *(char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4) = '\0';
  memset((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 5),0x1b,0x3ff);
  *(aiQuatKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = (aiQuatKey *)0x0;
  *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x40c) = 0;
  *(aiVectorKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = (aiVectorKey *)0x0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x430) = 0;
  __n = name->_M_string_length;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  if (__n < 0x400) {
    *(int *)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = (int)__n;
    memcpy((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4),
           (name->_M_dataplus)._M_p,__n);
    ((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4))[__n] = '\0';
  }
  ConvertScaleKeys(this,(aiNodeAnim *)
                        na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,curves,pLVar4,start,
                   stop,max_time,min_time);
  puVar3 = (undefined8 *)operator_new__(0x18);
  uVar2 = na;
  *puVar3 = 0;
  puVar3[1] = 0x3f800000;
  puVar3[2] = 0;
  *(undefined8 **)
   ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = puVar3;
  *(undefined4 *)
   ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = 1;
  *puVar3 = 0;
  lVar1 = *(long *)((long)na._M_t.
                          super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418);
  *(undefined8 *)(lVar1 + 8) = 0x3f800000;
  *(undefined8 *)(lVar1 + 0x10) = 0;
  puVar3 = (undefined8 *)operator_new__(0x18);
  *(undefined4 *)(puVar3 + 2) = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  *(undefined8 **)
   ((long)uVar2._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408) = puVar3;
  *(undefined4 *)
   ((long)uVar2._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 1;
  *puVar3 = 0;
  lVar1 = *(long *)((long)uVar2._M_t.
                          super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408);
  *(undefined8 *)(lVar1 + 8) = 0;
  *(undefined4 *)(lVar1 + 0x10) = 0;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&na);
  return (aiNodeAnim *)
         (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
         uVar2._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateScalingNodeAnim(const std::string& name,
            const Model& /*target*/,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertScaleKeys(na.get(), curves, layer_map, start, stop, max_time, min_time);

            // dummy rotation key
            na->mRotationKeys = new aiQuatKey[1];
            na->mNumRotationKeys = 1;

            na->mRotationKeys[0].mTime = 0.;
            na->mRotationKeys[0].mValue = aiQuaternion();

            // dummy position key
            na->mPositionKeys = new aiVectorKey[1];
            na->mNumPositionKeys = 1;

            na->mPositionKeys[0].mTime = 0.;
            na->mPositionKeys[0].mValue = aiVector3D();

            return na.release();
        }